

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmGeneratorTarget *pcVar3;
  size_type sVar4;
  pointer pcVar5;
  pointer pbVar6;
  cmComputeLinkInformation *pcVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  undefined7 extraout_var;
  string *psVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  LinkClosure *pLVar14;
  long *plVar15;
  undefined8 *puVar16;
  cmValue cVar17;
  ulong *puVar18;
  size_type *psVar19;
  byte bVar20;
  byte bVar21;
  pointer pbVar22;
  string *config;
  bool bVar23;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar24;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  string install_rpath;
  string d;
  string rootPath;
  string dirVar;
  string targetOutputDir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  cmComputeLinkInformation *local_1b0;
  undefined4 local_1a4;
  string *local_1a0;
  string local_198;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_178;
  string local_170;
  string *local_150;
  string local_148;
  string *local_118;
  string *local_110;
  string *local_108;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  pcVar2 = this->Makefile;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1b0 = this;
  local_178 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)runtimeDirs;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"CMAKE_SKIP_RPATH","");
  bVar8 = cmMakefile::IsOn(pcVar2,&local_1e0);
  bVar23 = (local_1b0->RuntimeFlag)._M_string_length == 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  bVar9 = true;
  if (!for_install) {
    pcVar3 = local_1b0->Target;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"BUILD_WITH_INSTALL_RPATH","");
    bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_80);
  }
  if ((!for_install) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2)) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (bVar8 || bVar23) {
    bVar20 = 0;
    bVar21 = 0;
  }
  else {
    bVar10 = cmGeneratorTarget::HaveInstallTreeRPATH(local_1b0->Target,&local_1b0->Config);
    bVar20 = bVar10 & bVar9;
    bVar10 = cmGeneratorTarget::HaveBuildTreeRPATH(local_1b0->Target,&local_1b0->Config);
    bVar21 = (bVar9 ^ 1U) & bVar10;
  }
  if ((bVar8 || bVar23) || (bVar9 ^ 1U) != 0) {
LAB_00445a84:
    bVar10 = false;
    local_1a4 = 0;
  }
  else {
    pcVar2 = local_1b0->Makefile;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"CMAKE_SKIP_INSTALL_RPATH","");
    bVar10 = cmMakefile::IsOn(pcVar2,&local_a0);
    if (bVar10) goto LAB_00445a84;
    pcVar3 = local_1b0->Target;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"INSTALL_RPATH_USE_LINK_PATH","");
    bVar10 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_c0);
    local_1a4 = (undefined4)CONCAT71(extraout_var,bVar10);
    bVar10 = true;
  }
  if ((bVar10) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2)) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if (((!bVar8 && !bVar23) && (bVar9 ^ 1U) == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = local_1b0->Makefile;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,"CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN","");
  psVar12 = cmMakefile::GetSafeDefinition(pcVar2,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = local_1b0;
  config = &local_1b0->Config;
  cmGeneratorTarget::GetDirectory(&local_e0,local_1b0->Target,config,RuntimeBinaryArtifact);
  pcVar3 = pcVar7->Target;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"BUILD_RPATH_USE_ORIGIN","");
  bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_1e0);
  sVar4 = psVar12->_M_string_length;
  local_1a0 = (string *)CONCAT71(local_1a0._1_7_,local_e0._M_string_length != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (bVar20 != 0) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_allocated_capacity =
         local_1e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    cmGeneratorTarget::GetInstallRPATH(local_1b0->Target,config,&local_1e0);
    cmCLI_ExpandListUnique
              (&local_1e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_178,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar21 == 0) {
    if ((char)local_1a4 == '\0') goto LAB_00446459;
  }
  else {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    local_1e0._M_string_length = 0;
    local_1e0.field_2._M_allocated_capacity =
         local_1e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar23 = cmGeneratorTarget::GetBuildRPATH(local_1b0->Target,config,&local_1e0);
    if (bVar23) {
      cmCLI_ExpandListUnique
                (&local_1e0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_178,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if (bVar21 == 0 && (char)local_1a4 == '\0') goto LAB_00446459;
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  pcVar2 = local_1b0->Makefile;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"CMAKE_SYSROOT_LINK","");
  cVar17 = cmMakefile::GetDefinition(pcVar2,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (cVar17.Value == (string *)0x0) {
    pcVar2 = local_1b0->Makefile;
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"CMAKE_SYSROOT","");
    cmMakefile::GetSafeDefinition(pcVar2,&local_1e0);
    std::__cxx11::string::_M_assign((string *)&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_170);
  }
  pcVar2 = local_1b0->Makefile;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"CMAKE_STAGING_PREFIX","");
  cVar17 = cmMakefile::GetDefinition(pcVar2,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = local_1b0->Makefile;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"CMAKE_INSTALL_PREFIX","");
  local_118 = cmMakefile::GetSafeDefinition(pcVar2,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  local_110 = psVar12;
  cmsys::SystemTools::ConvertToUnixSlashes(&local_170);
  pcVar7 = local_1b0;
  pvVar13 = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_
                      ((local_1b0->OrderRuntimeSearchPath)._M_t.
                       super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                       .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl);
  local_108 = config;
  local_150 = cmake::GetHomeOutputDirectory_abi_cxx11_(pcVar7->CMakeInstance);
  pbVar22 = (pvVar13->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (pvVar13->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar22 != pbVar6) {
    bVar20 = bVar8 & (byte)local_1a0;
    local_1a0 = cVar17.Value;
    if (cVar17.Value == (string *)0x0) {
      local_1a0 = &cmValue::Empty_abi_cxx11_;
    }
    do {
      if (bVar21 == 0) {
        if ((char)local_1a4 != '\0') {
          psVar12 = cmake::GetHomeDirectory_abi_cxx11_(local_1b0->CMakeInstance);
          bVar8 = cmsys::SystemTools::ComparePath(pbVar22,psVar12);
          if ((((!bVar8) && (bVar8 = cmsys::SystemTools::ComparePath(pbVar22,local_150), !bVar8)) &&
              (bVar8 = cmsys::SystemTools::IsSubDirectory(pbVar22,psVar12), !bVar8)) &&
             (bVar8 = cmsys::SystemTools::IsSubDirectory(pbVar22,local_150), !bVar8)) {
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            pcVar5 = (pbVar22->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_198,pcVar5,pcVar5 + pbVar22->_M_string_length);
            if (local_170._M_string_length == 0) {
LAB_004461b1:
              if ((cVar17.Value != (string *)0x0) && ((cVar17.Value)->_M_string_length != 0)) {
                local_1e0._M_dataplus._M_p = (pointer)local_198._M_string_length;
                local_1e0._M_string_length = (size_type)local_198._M_dataplus._M_p;
                __str_02._M_str = (local_1a0->_M_dataplus)._M_p;
                __str_02._M_len = local_1a0->_M_string_length;
                iVar11 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,0
                                    ,local_1a0->_M_string_length,__str_02);
                if (iVar11 == 0) {
                  std::__cxx11::string::erase((ulong)&local_198,0);
                  local_1e0._M_string_length = (size_type)(local_118->_M_dataplus)._M_p;
                  local_1e0._M_dataplus._M_p = (pointer)local_118->_M_string_length;
                  local_148._M_dataplus._M_p = &DAT_00000001;
                  local_1e0.field_2._8_8_ = &local_148.field_2;
                  local_148.field_2._M_local_buf[0] = 0x2f;
                  local_1e0.field_2._M_allocated_capacity = 1;
                  local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_198._M_string_length;
                  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_198._M_dataplus._M_p;
                  views_00._M_len = 3;
                  views_00._M_array = (iterator)&local_1e0;
                  local_148._M_string_length = local_1e0.field_2._8_8_;
                  cmCatViews_abi_cxx11_(&local_100,views_00);
                  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_100);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100._M_dataplus._M_p != &local_100.field_2) {
                    operator_delete(local_100._M_dataplus._M_p,
                                    local_100.field_2._M_allocated_capacity + 1);
                  }
                  cmsys::SystemTools::ConvertToUnixSlashes(&local_198);
                }
              }
            }
            else {
              local_1e0._M_dataplus._M_p = (pointer)local_198._M_string_length;
              local_1e0._M_string_length = (size_type)local_198._M_dataplus._M_p;
              __str_01._M_str = local_170._M_dataplus._M_p;
              __str_01._M_len = local_170._M_string_length;
              iVar11 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,0,
                                  local_170._M_string_length,__str_01);
              if (iVar11 != 0) goto LAB_004461b1;
              std::__cxx11::string::erase((ulong)&local_198,0);
            }
            pVar24 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)&local_60,&local_198);
            if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_178,&local_198);
            }
            goto LAB_004463ce;
          }
        }
      }
      else {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        pcVar5 = (pbVar22->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,pcVar5,pcVar5 + pbVar22->_M_string_length);
        if (local_170._M_string_length == 0) {
LAB_00445f8b:
          if ((cVar17.Value != (string *)0x0) && ((cVar17.Value)->_M_string_length != 0)) {
            local_1e0._M_dataplus._M_p = (pointer)local_198._M_string_length;
            local_1e0._M_string_length = (size_type)local_198._M_dataplus._M_p;
            __str_00._M_str = (local_1a0->_M_dataplus)._M_p;
            __str_00._M_len = local_1a0->_M_string_length;
            iVar11 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                               ((basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,0,
                                local_1a0->_M_string_length,__str_00);
            if (iVar11 == 0) {
              std::__cxx11::string::erase((ulong)&local_198,0);
              local_1e0._M_string_length = (size_type)(local_118->_M_dataplus)._M_p;
              local_1e0._M_dataplus._M_p = (pointer)local_118->_M_string_length;
              local_148._M_dataplus._M_p = &DAT_00000001;
              local_1e0.field_2._8_8_ = &local_148.field_2;
              local_148.field_2._M_local_buf[0] = 0x2f;
              local_1e0.field_2._M_allocated_capacity = 1;
              local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_198._M_string_length;
              local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_198._M_dataplus._M_p;
              views_01._M_len = 3;
              views_01._M_array = (iterator)&local_1e0;
              local_148._M_string_length = local_1e0.field_2._8_8_;
              cmCatViews_abi_cxx11_(&local_100,views_01);
              std::__cxx11::string::operator=((string *)&local_198,(string *)&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
              cmsys::SystemTools::ConvertToUnixSlashes(&local_198);
              goto LAB_004463ac;
            }
          }
          if (((bVar20 & sVar4 != 0) != 0) &&
             ((bVar8 = cmsys::SystemTools::ComparePath(&local_198,local_150), bVar8 ||
              (bVar8 = cmsys::SystemTools::IsSubDirectory(&local_198,local_150), bVar8)))) {
            cmSystemTools::RelativePath(&local_1e0,&local_e0,&local_198);
            std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_string_length ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::__cxx11::string::_M_assign((string *)&local_198);
            }
            else {
              local_1e0._M_string_length = (size_type)(local_110->_M_dataplus)._M_p;
              local_1e0._M_dataplus._M_p = (pointer)local_110->_M_string_length;
              local_1e0.field_2._M_allocated_capacity = 1;
              local_1e0.field_2._8_8_ =
                   (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
              local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_198._M_string_length;
              local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_198._M_dataplus._M_p;
              views._M_len = 3;
              views._M_array = (iterator)&local_1e0;
              cmCatViews_abi_cxx11_(&local_148,views);
              std::__cxx11::string::operator=((string *)&local_198,(string *)&local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                operator_delete(local_148._M_dataplus._M_p,
                                local_148.field_2._M_allocated_capacity + 1);
              }
            }
          }
        }
        else {
          local_1e0._M_dataplus._M_p = (pointer)local_198._M_string_length;
          local_1e0._M_string_length = (size_type)local_198._M_dataplus._M_p;
          __str._M_str = local_170._M_dataplus._M_p;
          __str._M_len = local_170._M_string_length;
          iVar11 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             ((basic_string_view<char,_std::char_traits<char>_> *)&local_1e0,0,
                              local_170._M_string_length,__str);
          if (iVar11 != 0) goto LAB_00445f8b;
          std::__cxx11::string::erase((ulong)&local_198,0);
        }
LAB_004463ac:
        pVar24 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&local_60,&local_198);
        if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_178,&local_198);
        }
LAB_004463ce:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
      }
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != pbVar6);
  }
  config = local_108;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,
                    CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                             local_170.field_2._M_local_buf[0]) + 1);
    config = local_108;
  }
LAB_00446459:
  pLVar14 = cmGeneratorTarget::GetLinkClosure(local_1b0->Target,config);
  pbVar22 = (pLVar14->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar6 = (pLVar14->Languages).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar22 != pbVar6) {
    paVar1 = &local_148.field_2;
    do {
      std::operator+(&local_148,"CMAKE_",pbVar22);
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_148);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      puVar18 = (ulong *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_1e0.field_2._M_allocated_capacity = *puVar18;
        local_1e0.field_2._8_8_ = plVar15[3];
      }
      else {
        local_1e0.field_2._M_allocated_capacity = *puVar18;
        local_1e0._M_dataplus._M_p = (pointer)*plVar15;
      }
      local_1e0._M_string_length = plVar15[1];
      *plVar15 = (long)puVar18;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != paVar1) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      bVar8 = cmMakefile::IsOn(local_1b0->Makefile,&local_1e0);
      if (bVar8) {
        std::operator+(&local_170,"CMAKE_",pbVar22);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_170);
        psVar19 = puVar16 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar19) {
          local_148.field_2._M_allocated_capacity = *psVar19;
          local_148.field_2._8_8_ = puVar16[3];
          local_148._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar19;
          local_148._M_dataplus._M_p = (pointer)*puVar16;
        }
        local_148._M_string_length = puVar16[1];
        *puVar16 = psVar19;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,
                          CONCAT71(local_170.field_2._M_allocated_capacity._1_7_,
                                   local_170.field_2._M_local_buf[0]) + 1);
        }
        cVar17 = cmMakefile::GetDefinition(local_1b0->Makefile,&local_148);
        if (cVar17.Value != (string *)0x0) {
          cmCLI_ExpandListUnique
                    (cVar17.Value,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_178,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_60);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != paVar1) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != pbVar6);
  }
  cmCLI_ExpandListUnique
            (&local_1b0->RuntimeAlways,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_178,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install) const
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH(this->Config) &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Select whether to use $ORIGIN in RPATHs for artifacts in the build tree.
  std::string const& originToken = this->Makefile->GetSafeDefinition(
    "CMAKE_SHARED_LIBRARY_RPATH_ORIGIN_TOKEN");
  std::string targetOutputDir = this->Target->GetDirectory(this->Config);
  bool use_relative_build_rpath =
    this->Target->GetPropertyAsBool("BUILD_RPATH_USE_ORIGIN") &&
    !originToken.empty() && !targetOutputDir.empty();

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    std::string install_rpath;
    this->Target->GetInstallRPATH(this->Config, install_rpath);
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    std::string build_rpath;
    if (this->Target->GetBuildRPATH(this->Config, build_rpath)) {
      // This will not resolve entries to use $ORIGIN, the user is expected
      // to do that if necessary.
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (cmValue sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = *sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    cmValue stagePath = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    std::string const& installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    std::string const& topBinaryDir =
      this->CMakeInstance->GetHomeOutputDirectory();
    for (std::string const& ri : rdirs) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = ri;
        if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
          d.erase(0, rootPath.size());
        } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
          d.erase(0, (*stagePath).size());
          d = cmStrCat(installPrefix, '/', d);
          cmSystemTools::ConvertToUnixSlashes(d);
        } else if (use_relative_build_rpath) {
          // If expansion of the $ORIGIN token is supported and permitted per
          // policy, use relative paths in the RPATH.
          if (cmSystemTools::ComparePath(d, topBinaryDir) ||
              cmSystemTools::IsSubDirectory(d, topBinaryDir)) {
            d = cmSystemTools::RelativePath(targetOutputDir, d);
            if (!d.empty()) {
              d = cmStrCat(originToken, "/", d);
            } else {
              d = originToken;
            }
          }
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(std::move(d));
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        std::string const& topSourceDir =
          this->CMakeInstance->GetHomeDirectory();
        if (!cmSystemTools::ComparePath(ri, topSourceDir) &&
            !cmSystemTools::ComparePath(ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(ri, topBinaryDir)) {
          std::string d = ri;
          if (!rootPath.empty() && cmHasPrefix(d, rootPath)) {
            d.erase(0, rootPath.size());
          } else if (cmNonempty(stagePath) && cmHasPrefix(d, *stagePath)) {
            d.erase(0, (*stagePath).size());
            d = cmStrCat(installPrefix, '/', d);
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(std::move(d));
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::string const& li : lc->Languages) {
      std::string useVar =
        "CMAKE_" + li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + li + "_IMPLICIT_LINK_DIRECTORIES";
        if (cmValue dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(*dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways, runtimeDirs, emitted);
}